

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void ClearInventory(AActor *activator)

{
  int local_14;
  int i;
  AActor *activator_local;
  
  if (activator == (AActor *)0x0) {
    for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
      if ((playeringame[local_14] & 1U) != 0) {
        AActor::ClearInventory((AActor *)(&players)[(long)local_14 * 0x54]);
      }
    }
  }
  else {
    AActor::ClearInventory(activator);
  }
  return;
}

Assistant:

static void ClearInventory (AActor *activator)
{
	if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->ClearInventory();
		}
	}
	else
	{
		activator->ClearInventory();
	}
}